

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserFastaTest_ParseWholeWithoutTrimming_Test::
~BioparserFastaTest_ParseWholeWithoutTrimming_Test
          (BioparserFastaTest_ParseWholeWithoutTrimming_Test *this)

{
  BioparserFastaTest_ParseWholeWithoutTrimming_Test *this_local;
  
  ~BioparserFastaTest_ParseWholeWithoutTrimming_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, ParseWholeWithoutTrimming) {
  Setup("sample.fasta");
  s = p->Parse(-1, false);
  Check(false);
}